

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

int array_equals(uint32_t *a1,int32_t size1,uint32_t *a2,int32_t size2)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = 0;
  if (size1 == size2) {
    uVar2 = 0;
    uVar4 = (ulong)(uint)size1;
    if (size1 < 1) {
      uVar4 = uVar2;
    }
    do {
      uVar3 = uVar2;
      if (uVar4 == uVar3) break;
      uVar2 = uVar3 + 1;
    } while (a1[uVar3] == a2[uVar3]);
    uVar1 = (uint)((long)size1 <= (long)uVar3);
  }
  return uVar1;
}

Assistant:

static int array_equals(const uint32_t *a1, int32_t size1, const uint32_t *a2,
                        int32_t size2) {
    if (size1 != size2) return 0;
    for (int i = 0; i < size1; ++i) {
        if (a1[i] != a2[i]) {
            return 0;
        }
    }
    return 1;
}